

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc_analyzer.cc
# Opt level: O0

void __thiscall
sptk::reaper::LpcAnalyzer::Durbin(LpcAnalyzer *this,float *r,float *k,float *a,int p,float *ex)

{
  float *in_RCX;
  float *in_RDX;
  float *in_RSI;
  int in_R8D;
  float *in_R9;
  float local_1d8;
  float local_1d4;
  int local_1d0;
  int local_1cc;
  float local_1c8 [84];
  float *b;
  float s;
  float e;
  int j;
  int i;
  
  local_1d4 = *in_RSI;
  *in_RDX = -in_RSI[1] / local_1d4;
  *in_RCX = *in_RDX;
  local_1d4 = local_1d4 * (1.0 - *in_RDX * *in_RDX);
  for (local_1cc = 1; local_1cc < in_R8D; local_1cc = local_1cc + 1) {
    local_1d8 = 0.0;
    for (local_1d0 = 0; local_1d0 < local_1cc; local_1d0 = local_1d0 + 1) {
      local_1d8 = -in_RCX[local_1d0] * in_RSI[local_1cc - local_1d0] + local_1d8;
    }
    in_RDX[local_1cc] = (local_1d8 - in_RSI[local_1cc + 1]) / local_1d4;
    in_RCX[local_1cc] = in_RDX[local_1cc];
    for (local_1d0 = 0; local_1d0 <= local_1cc; local_1d0 = local_1d0 + 1) {
      local_1c8[local_1d0] = in_RCX[local_1d0];
    }
    for (local_1d0 = 0; local_1d0 < local_1cc; local_1d0 = local_1d0 + 1) {
      in_RCX[local_1d0] =
           in_RDX[local_1cc] * local_1c8[(local_1cc - local_1d0) + -1] + in_RCX[local_1d0];
    }
    local_1d4 = local_1d4 * (1.0 - in_RDX[local_1cc] * in_RDX[local_1cc]);
  }
  *in_R9 = local_1d4;
  return;
}

Assistant:

void LpcAnalyzer::Durbin(float* r, float* k, float* a, int p, float* ex) {
  float  bb[BIGSORD];
  int i, j;
  float e, s, *b = bb;

  e = *r;
  *k = -r[1] / e;
  *a = *k;
  e *= (1.0 - (*k) * (*k));
  for (i = 1; i < p; i++) {
    s = 0;
    for (j = 0; j < i; j++) {
      s -= a[j] * r[i - j];
    }
    k[i] = (s - r[i + 1]) / e;
    a[i] = k[i];
    for (j = 0; j <= i; j++) {
      b[j] = a[j];
    }
    for (j = 0; j < i; j++) {
      a[j] += k[i] * b[i - j - 1];
    }
    e *= (1.0 - (k[i] * k[i]));
  }
  *ex = e;
}